

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O2

bool ImGui_ImplOpenGL2_Init(void)

{
  ImGuiIO *pIVar1;
  undefined4 *puVar2;
  
  pIVar1 = ImGui::GetIO();
  ImGui::DebugCheckVersionAndDataLayout("1.91.0",0x38f8,0x484,8,0x10,0x14,4);
  puVar2 = (undefined4 *)ImGui::MemAlloc(4);
  *puVar2 = 0;
  pIVar1->BackendRendererUserData = puVar2;
  pIVar1->BackendRendererName = "imgui_impl_opengl2";
  return true;
}

Assistant:

bool    ImGui_ImplOpenGL2_Init()
{
    ImGuiIO& io = ImGui::GetIO();
    IMGUI_CHECKVERSION();
    IM_ASSERT(io.BackendRendererUserData == nullptr && "Already initialized a renderer backend!");

    // Setup backend capabilities flags
    ImGui_ImplOpenGL2_Data* bd = IM_NEW(ImGui_ImplOpenGL2_Data)();
    io.BackendRendererUserData = (void*)bd;
    io.BackendRendererName = "imgui_impl_opengl2";

    return true;
}